

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
tinyusdz::GeomMesh::get_faceVertexCounts
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeomMesh *this,double time)

{
  bool bVar1;
  optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> pv;
  vector<int,_std::allocator<int>_> local_78;
  undefined1 local_58 [8];
  Animatable<std::vector<int,_std::allocator<int>_>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (this->faceVertexCounts)._attrib.has_value_;
  if (((((bVar1 != false) ||
        ((this->faceVertexCounts)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->faceVertexCounts)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start)) || ((this->faceVertexCounts)._value_empty != false)) ||
      ((this->faceVertexCounts)._blocked == true)) &&
     (((this->faceVertexCounts)._blocked == false &&
      (((this->faceVertexCounts)._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->faceVertexCounts)._paths.
        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start & (bVar1 ^ 1U)) == 0)))) {
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
    ::optional((optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)local_58,
               &(this->faceVertexCounts)._attrib);
    if ((bool)local_58[0] == true) {
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar1 = Animatable<std::vector<int,_std::allocator<int>_>_>::get
                        ((Animatable<std::vector<int,_std::allocator<int>_>_> *)(local_58 + 8),time,
                         &local_78,Held);
      if (bVar1) {
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
      }
      else if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if ((local_58[0] & 1) != 0) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::destruct_value
                ((storage_t<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                 (local_58 + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> GeomMesh::get_faceVertexCounts(double time) const {
  std::vector<int32_t> dst;

  if (!faceVertexCounts.authored() || faceVertexCounts.is_blocked()) {
    return dst;
  }

  if (faceVertexCounts.is_connection()) {
    // TODO: connection
    return dst;
  }

  if (auto pv = faceVertexCounts.get_value()) {
    std::vector<int32_t> val;
    if (pv.value().get(time, &val, value::TimeSampleInterpolationType::Held)) {
      dst = std::move(val);
    }
  }
  return dst;
}